

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_buf.c
# Opt level: O0

int nghttp2_bufs_wrap_init(nghttp2_bufs *bufs,uint8_t *begin,size_t len,nghttp2_mem *mem)

{
  nghttp2_buf_chain *pnVar1;
  nghttp2_buf_chain *chain;
  nghttp2_mem *mem_local;
  size_t len_local;
  uint8_t *begin_local;
  nghttp2_bufs *bufs_local;
  
  pnVar1 = (nghttp2_buf_chain *)nghttp2_mem_malloc(mem,0x30);
  if (pnVar1 == (nghttp2_buf_chain *)0x0) {
    bufs_local._4_4_ = -0x385;
  }
  else {
    pnVar1->next = (nghttp2_buf_chain *)0x0;
    nghttp2_buf_wrap_init(&pnVar1->buf,begin,len);
    bufs->mem = mem;
    bufs->offset = 0;
    bufs->head = pnVar1;
    bufs->cur = bufs->head;
    bufs->chunk_length = len;
    bufs->chunk_used = 1;
    bufs->max_chunk = 1;
    bufs->chunk_keep = 1;
    bufs_local._4_4_ = 0;
  }
  return bufs_local._4_4_;
}

Assistant:

int nghttp2_bufs_wrap_init(nghttp2_bufs *bufs, uint8_t *begin, size_t len,
                           nghttp2_mem *mem) {
  nghttp2_buf_chain *chain;

  chain = nghttp2_mem_malloc(mem, sizeof(nghttp2_buf_chain));
  if (chain == NULL) {
    return NGHTTP2_ERR_NOMEM;
  }

  chain->next = NULL;

  nghttp2_buf_wrap_init(&chain->buf, begin, len);

  bufs->mem = mem;
  bufs->offset = 0;

  bufs->head = chain;
  bufs->cur = bufs->head;

  bufs->chunk_length = len;
  bufs->chunk_used = 1;
  bufs->max_chunk = 1;
  bufs->chunk_keep = 1;

  return 0;
}